

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.c
# Opt level: O0

void prf_texture_entry_f(prf_node_t *node,prf_state_t *state)

{
  void *pvVar1;
  long in_RSI;
  ushort *in_RDI;
  void *unaff_retaddr;
  
  if (*in_RDI == prf_texture_info.opcode) {
    pvVar1 = prf_array_append_ptr(unaff_retaddr,in_RDI);
    *(void **)(in_RSI + 0x38) = pvVar1;
  }
  else {
    prf_error(9,"texture entry state method tried on node of type %d.",(ulong)*in_RDI);
  }
  return;
}

Assistant:

static
void
prf_texture_entry_f(
    prf_node_t * node,
    prf_state_t * state )
{
    assert( node != NULL && state != NULL );

    if ( node->opcode != prf_texture_info.opcode ) {
        prf_error( 9, "texture entry state method tried on node of type %d.",
                   node->opcode );
        return;
    }
    state->textures =
        (prf_node_t **) prf_array_append_ptr( state->textures, node );
}